

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  uint *puVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  TestCase *pTVar6;
  int result_1;
  long lVar7;
  uint uVar8;
  int result;
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  timeval t;
  timeval local_28;
  
  iVar9 = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar7 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->timer).m_ticks;
  auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = 0x45300000;
  (this->super_CurrentTestCaseStats).seconds =
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1000000.0;
  lVar7 = 0;
  do {
    iVar9 = iVar9 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar7 + -4)
    ;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAsserts;
  *piVar1 = *piVar1 + iVar9;
  iVar9 = 0;
  lVar7 = 0;
  do {
    iVar9 = iVar9 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar7 + -4);
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAssertsFailed;
  *piVar1 = *piVar1 + iVar9;
  iVar9 = 0;
  lVar7 = 0;
  do {
    iVar9 = iVar9 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar7 + -4)
    ;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar9;
  iVar9 = 0;
  lVar7 = 0;
  do {
    iVar9 = iVar9 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar7 + -4);
    lVar7 = lVar7 + 0x40;
  } while (lVar7 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar9;
  if (iVar9 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  pTVar6 = (this->super_ContextOptions).currentTest;
  dVar3 = (pTVar6->super_TestCaseData).m_timeout;
  dVar12 = ABS(dVar3);
  dVar14 = dVar12;
  if (dVar12 <= 0.0) {
    dVar14 = 0.0;
  }
  if (((dVar14 + 1.0) * 2.220446049250313e-16 <= ABS(0.0 - dVar3)) &&
     (dVar14 = (this->super_CurrentTestCaseStats).seconds, dVar3 < dVar14)) {
    dVar13 = ABS(dVar14);
    if (ABS(dVar14) <= dVar12) {
      dVar13 = dVar12;
    }
    if ((dVar13 + 1.0) * 2.220446049250313e-16 <= ABS(dVar3 - dVar14)) {
      piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    }
  }
  uVar4 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar6->super_TestCaseData).m_should_fail == true) {
    uVar8 = 0x20;
    if (uVar4 != 0) {
      uVar8 = uVar4 | 0x40;
    }
  }
  else if ((uVar4 == 0) || ((pTVar6->super_TestCaseData).m_may_fail != true)) {
    iVar5 = (pTVar6->super_TestCaseData).m_expected_failures;
    if (iVar5 < 1) goto LAB_001153fb;
    if (iVar9 == iVar5) {
      uVar8 = uVar4 | 0x100;
    }
    else {
      uVar8 = uVar4 | 0x80;
    }
  }
  else {
    uVar8 = uVar4 | 0x200;
  }
  (this->super_CurrentTestCaseStats).failure_flags = uVar8;
LAB_001153fb:
  uVar4 = (this->super_CurrentTestCaseStats).failure_flags;
  bVar10 = (uVar4 & 0x340) != 0;
  (this->super_CurrentTestCaseStats).testCaseSuccess = uVar4 == 0 || bVar10;
  if (uVar4 != 0 && !bVar10) {
    puVar2 = &(this->super_TestRunStats).numTestCasesFailed;
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            testCaseSuccess = !(failure_flags && !ok_to_fail);
            if(!testCaseSuccess)
                numTestCasesFailed++;
        }